

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_attach(lua_State *L)

{
  int iVar1;
  GCfunc *L_00;
  GCstr *pGVar2;
  TValue *pTVar3;
  cTValue *in_RDI;
  undefined4 unaff_retaddr;
  uint32_t h;
  uint8_t *p;
  GCstr *s;
  GCfunc *fn;
  int in_stack_ffffffffffffffdc;
  lua_State *in_stack_ffffffffffffffe0;
  GCstr *pGVar4;
  undefined8 in_stack_ffffffffffffffe8;
  undefined8 uVar5;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  L_00 = lj_lib_checkfunc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  pGVar2 = lj_lib_optstr((lua_State *)&L_00->c,iVar1);
  luaL_findtable((lua_State *)p,h,(char *)&in_RDI->u64,(int)((ulong)L_00 >> 0x20));
  if (pGVar2 == (GCstr *)0x0) {
    pTVar3 = (TValue *)in_RDI[3].u64;
    in_RDI[3].u64 = (uint64_t)(pTVar3 + 1);
    (pTVar3->field_2).it = 0xffffffff;
    uVar5 = 0;
    while (iVar1 = lua_next((lua_State *)&L_00->c,(int)((ulong)uVar5 >> 0x20)), iVar1 != 0) {
      in_RDI[3].u64 = in_RDI[3].u64 - 8;
      if ((*(int *)(in_RDI[3].u64 + 4) == -9) && ((GCfunc *)(ulong)*(uint *)in_RDI[3] == L_00)) {
        pTVar3 = lj_tab_set((lua_State *)p,(GCtab *)CONCAT44(h,unaff_retaddr),in_RDI);
        (pTVar3->field_2).it = 0xffffffff;
      }
    }
  }
  else {
    pGVar4 = pGVar2 + 1;
    while ((char)(pGVar4->nextgc).gcptr32 != '\0') {
      pGVar4 = (GCstr *)((long)&(pGVar4->nextgc).gcptr32 + 1);
    }
    lua_pushvalue((lua_State *)&L_00->c,(int)((ulong)pGVar2 >> 0x20));
    lua_rawseti((lua_State *)&in_RDI->field_2,(int)((ulong)L_00 >> 0x20),(int)L_00);
    *(undefined1 *)((ulong)in_RDI[1].u32.lo + 0x10b) = 0xff;
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_attach)
{
#ifdef LUAJIT_DISABLE_VMEVENT
  luaL_error(L, "vmevent API disabled");
#else
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  GCstr *s = lj_lib_optstr(L, 2);
  luaL_findtable(L, LUA_REGISTRYINDEX, LJ_VMEVENTS_REGKEY, LJ_VMEVENTS_HSIZE);
  if (s) {  /* Attach to given event. */
    const uint8_t *p = (const uint8_t *)strdata(s);
    uint32_t h = s->len;
    while (*p) h = h ^ (lj_rol(h, 6) + *p++);
    lua_pushvalue(L, 1);
    lua_rawseti(L, -2, VMEVENT_HASHIDX(h));
    G(L)->vmevmask = VMEVENT_NOCACHE;  /* Invalidate cache. */
  } else {  /* Detach if no event given. */
    setnilV(L->top++);
    while (lua_next(L, -2)) {
      L->top--;
      if (tvisfunc(L->top) && funcV(L->top) == fn) {
	setnilV(lj_tab_set(L, tabV(L->top-2), L->top-1));
      }
    }
  }
#endif
  return 0;
}